

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

edgeTy __thiscall Apt::GetPosEdgeType(Apt *this,positionTy *_pos,size_t *_pIdxE)

{
  pointer pTVar1;
  edgeTy eVar2;
  long lVar3;
  ulong uVar4;
  positionTy *ppVar5;
  size_t sVar6;
  positionTy *ppVar7;
  positionTy basePos;
  vecIdxTy local_78;
  positionTy local_58;
  
  sVar6 = _pos->edgeIdx;
  if (_pos->edgeIdx == 0xffffffffffffffff) {
    ppVar5 = _pos;
    ppVar7 = &local_58;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      ppVar7->_lat = ppVar5->_lat;
      ppVar5 = (positionTy *)&ppVar5->_lon;
      ppVar7 = (positionTy *)&ppVar7->_lon;
    }
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FindClosestEdge(this,_pos,&local_58,(double)dataRefs.fdSnapTaxiDist,30.0,80.0,&local_78);
    sVar6 = local_58.edgeIdx;
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      sVar6 = local_58.edgeIdx;
    }
  }
  if (_pIdxE != (size_t *)0x0) {
    *_pIdxE = sVar6;
  }
  eVar2 = UNKNOWN_WAY;
  if (sVar6 != 0xfffffffffffffffe) {
    pTVar1 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) *
            -0x3333333333333333;
    if (uVar4 < sVar6 || uVar4 - sVar6 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    eVar2 = pTVar1[sVar6].type;
  }
  return eVar2;
}

Assistant:

TaxiEdge::edgeTy GetPosEdgeType (const positionTy& _pos, size_t* _pIdxE = nullptr) const
    {
        // Haven't yet analysed this position?
        size_t idxE = _pos.edgeIdx;
        if (idxE == EDGE_UNKNOWN) {
            // Find the closest edge and update idxE
            positionTy basePos = _pos;
            FindClosestEdge(_pos, basePos,
                            dataRefs.GetFdSnapTaxiDist_m(),
                            ART_EDGE_ANGLE_TOLERANCE,
                            ART_EDGE_ANGLE_TOLERANCE_EXT);
            idxE = basePos.edgeIdx;
        }
        
        // return the edge's index if requested
        if (_pIdxE) *_pIdxE = idxE;
        
        // position is analyzed, but no edge found?
        if (idxE == EDGE_UNAVAIL)
            return TaxiEdge::UNKNOWN_WAY;
        
        // return the edge's type
        return vecTaxiEdges.at(idxE).GetType();
    }